

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_symmetrizing.cc
# Opt level: O0

int __thiscall
anon_unknown.dwarf_5ace::CalculateDataLength
          (anon_unknown_dwarf_5ace *this,int fft_length,InputOutputFormats format)

{
  InputOutputFormats format_local;
  int fft_length_local;
  int local_4;
  
  local_4 = (int)this;
  switch(fft_length) {
  case 0:
    local_4 = local_4 / 2 + 1;
    break;
  case 1:
    break;
  case 2:
    local_4 = local_4 + 1;
    break;
  case 3:
    local_4 = local_4 + 1;
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CalculateDataLength(int fft_length,
                        sptk::DataSymmetrizing::InputOutputFormats format) {
  switch (format) {
    case sptk::DataSymmetrizing::InputOutputFormats::kStandard: {
      return fft_length / 2 + 1;
    }
    case sptk::DataSymmetrizing::InputOutputFormats::
        kSymmetricForApplyingFourierTransform: {
      return fft_length;
    }
    case sptk::DataSymmetrizing::InputOutputFormats::
        kSymmetricForPreservingFrequencyResponse: {
      return fft_length + 1;
    }
    case sptk::DataSymmetrizing::InputOutputFormats::
        kSymmetricForPlottingFrequencyResponse: {
      return fft_length + 1;
    }
    default: {
      return 0;
    }
  }
}